

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

int mime_mem_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  long lVar2;
  
  if (whence == 1) {
    lVar2 = 0x98;
  }
  else {
    if (whence != 2) goto LAB_004734b2;
    lVar2 = 0x78;
  }
  offset = offset + *(long *)((long)instream + lVar2);
LAB_004734b2:
  iVar1 = 1;
  if ((-1 < offset) && (offset <= *(long *)((long)instream + 0x78))) {
    *(curl_off_t *)((long)instream + 0x98) = offset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int mime_mem_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  switch(whence) {
  case SEEK_CUR:
    offset += part->state.offset;
    break;
  case SEEK_END:
    offset += part->datasize;
    break;
  }

  if(offset < 0 || offset > part->datasize)
    return CURL_SEEKFUNC_FAIL;

  part->state.offset = (size_t) offset;
  return CURL_SEEKFUNC_OK;
}